

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::writeFinalRule
          (VTimeZone *this,VTZWriter *writer,UBool isDst,AnnualTimeZoneRule *rule,
          int32_t fromRawOffset,int32_t fromDSTSavings,UDate startTime,UErrorCode *status)

{
  TimeRuleType TVar1;
  int32_t iVar2;
  uint dayOfWeek;
  DateRuleType DVar3;
  int32_t iVar4;
  int32_t iVar5;
  DateTimeRule *pDVar6;
  uint uVar7;
  ulong uVar8;
  VTZWriter *size;
  uint uVar9;
  int iVar10;
  bool bVar11;
  int32_t local_b8;
  UDate local_b0;
  uint local_a4;
  uint local_78;
  UnicodeString name;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  size = writer;
  pDVar6 = AnnualTimeZoneRule::getRule(rule);
  TVar1 = DateTimeRule::getTimeRuleType(pDVar6);
  if (TVar1 != WALL_TIME) {
    iVar2 = DateTimeRule::getRuleMillisInDay(pDVar6);
    TVar1 = DateTimeRule::getTimeRuleType(pDVar6);
    if (TVar1 == UTC_TIME) {
      iVar10 = fromDSTSavings + fromRawOffset;
    }
    else {
      TVar1 = DateTimeRule::getTimeRuleType(pDVar6);
      iVar10 = 0;
      if (TVar1 == STANDARD_TIME) {
        iVar10 = fromDSTSavings;
      }
    }
    uVar9 = iVar10 + iVar2;
    if ((int)uVar9 < 0) {
      uVar9 = uVar9 + 86400000;
      local_a4 = 0xffffffff;
LAB_0021985e:
      bVar11 = false;
    }
    else {
      if (86399999 < uVar9) {
        local_a4 = 1;
        uVar9 = uVar9 + 0xfad9a400;
        goto LAB_0021985e;
      }
      local_a4 = 0;
      bVar11 = true;
    }
    local_78 = DateTimeRule::getRuleMonth(pDVar6);
    uVar8 = (ulong)local_78;
    local_b8 = DateTimeRule::getRuleDayOfMonth(pDVar6);
    dayOfWeek = DateTimeRule::getRuleDayOfWeek(pDVar6);
    DVar3 = DateTimeRule::getDateRuleType(pDVar6);
    if (bVar11) {
      if (DVar3 != DOM) {
LAB_0021998f:
        pDVar6 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
        if (pDVar6 != (DateTimeRule *)0x0) {
          DateTimeRule::DateTimeRule
                    (pDVar6,local_78,local_b8,dayOfWeek,DVar3 == DOW_GEQ_DOM,uVar9,WALL_TIME);
          bVar11 = false;
          goto LAB_002199db;
        }
        goto LAB_002199cd;
      }
    }
    else {
      if (DVar3 == DOW) {
        iVar2 = DateTimeRule::getRuleWeekInMonth(pDVar6);
        if (iVar2 < 1) {
          local_b8 = iVar2 * 7 + *(int *)(MONTHLENGTH + (long)(int)local_78 * 4) + 7;
          DVar3 = DOW_LEQ_DOM;
        }
        else {
          local_b8 = iVar2 * 7 + -6;
          DVar3 = DOW_GEQ_DOM;
        }
      }
      size = (VTZWriter *)(ulong)local_a4;
      local_b8 = local_b8 + local_a4;
      if (local_b8 == 0) {
        uVar8 = 0xb;
        if (0 < (int)local_78) {
          uVar8 = (ulong)(local_78 - 1);
        }
        local_b8 = *(int32_t *)(MONTHLENGTH + uVar8 * 4);
      }
      else if (*(int *)(MONTHLENGTH + (long)(int)local_78 * 4) < local_b8) {
        uVar7 = 0;
        if ((int)local_78 < 0xb) {
          uVar7 = local_78 + 1;
        }
        local_b8 = 1;
        uVar8 = (ulong)uVar7;
      }
      local_78 = (uint)uVar8;
      if (DVar3 != DOM) {
        bVar11 = SCARRY4(dayOfWeek,local_a4);
        dayOfWeek = dayOfWeek + local_a4;
        if (dayOfWeek == 0 || bVar11 != (int)dayOfWeek < 0) {
          dayOfWeek = 7;
        }
        else if (7 < dayOfWeek) {
          dayOfWeek = 1;
        }
        goto LAB_0021998f;
      }
    }
    pDVar6 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (pDVar6 != (DateTimeRule *)0x0) {
      bVar11 = false;
      DateTimeRule::DateTimeRule(pDVar6,local_78,local_b8,uVar9,WALL_TIME);
      goto LAB_002199db;
    }
  }
LAB_002199cd:
  pDVar6 = AnnualTimeZoneRule::getRule(rule);
  bVar11 = true;
LAB_002199db:
  uVar9 = DateTimeRule::getRuleMillisInDay(pDVar6);
  if ((int)uVar9 < 0) {
    local_b0 = startTime + (double)(int)-uVar9;
  }
  else {
    local_b0 = startTime;
    if (86399999 < uVar9) {
      local_b0 = startTime - (double)(int)(uVar9 + 0xfad9a401);
    }
  }
  iVar2 = TimeZoneRule::getRawOffset(&rule->super_TimeZoneRule);
  iVar4 = TimeZoneRule::getDSTSavings(&rule->super_TimeZoneRule);
  name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  name.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&rule->super_TimeZoneRule,&name);
  DVar3 = DateTimeRule::getDateRuleType(pDVar6);
  if (DVar3 < 4) {
    iVar10 = iVar4 + iVar2;
    switch(DVar3) {
    case DOM:
      iVar2 = DateTimeRule::getRuleMonth(pDVar6);
      iVar4 = DateTimeRule::getRuleDayOfMonth(pDVar6);
      writeZonePropsByDOM(this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar10,iVar2,iVar4,
                          local_b0,1.838821689216e+17,status);
      break;
    case DOW:
      iVar2 = DateTimeRule::getRuleMonth(pDVar6);
      iVar4 = DateTimeRule::getRuleWeekInMonth(pDVar6);
      iVar5 = DateTimeRule::getRuleDayOfWeek(pDVar6);
      writeZonePropsByDOW(this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar10,iVar2,iVar4,
                          iVar5,local_b0,1.838821689216e+17,status);
      break;
    case DOW_GEQ_DOM:
      iVar2 = DateTimeRule::getRuleMonth(pDVar6);
      iVar4 = DateTimeRule::getRuleDayOfMonth(pDVar6);
      iVar5 = DateTimeRule::getRuleDayOfWeek(pDVar6);
      writeZonePropsByDOW_GEQ_DOM
                (this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar10,iVar2,iVar4,iVar5,
                 local_b0,1.838821689216e+17,status);
      break;
    case DOW_LEQ_DOM:
      iVar2 = DateTimeRule::getRuleMonth(pDVar6);
      iVar4 = DateTimeRule::getRuleDayOfMonth(pDVar6);
      iVar5 = DateTimeRule::getRuleDayOfWeek(pDVar6);
      writeZonePropsByDOW_LEQ_DOM
                (this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar10,iVar2,iVar4,iVar5,
                 local_b0,1.838821689216e+17,status);
    }
  }
  if (!bVar11) {
    (*(pDVar6->super_UObject)._vptr_UObject[1])(pDVar6);
  }
  UnicodeString::~UnicodeString(&name);
  return;
}

Assistant:

void
VTimeZone::writeFinalRule(VTZWriter& writer, UBool isDst, const AnnualTimeZoneRule* rule,
                          int32_t fromRawOffset, int32_t fromDSTSavings,
                          UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    UBool modifiedRule = TRUE;
    const DateTimeRule *dtrule = toWallTimeRule(rule->getRule(), fromRawOffset, fromDSTSavings);
    if (dtrule == NULL) {
        modifiedRule = FALSE;
        dtrule = rule->getRule();
    }

    // If the rule's mills in a day is out of range, adjust start time.
    // Olson tzdata supports 24:00 of a day, but VTIMEZONE does not.
    // See ticket#7008/#7518

    int32_t timeInDay = dtrule->getRuleMillisInDay();
    if (timeInDay < 0) {
        startTime = startTime + (0 - timeInDay);
    } else if (timeInDay >= U_MILLIS_PER_DAY) {
        startTime = startTime - (timeInDay - (U_MILLIS_PER_DAY - 1));
    }

    int32_t toOffset = rule->getRawOffset() + rule->getDSTSavings();
    UnicodeString name;
    rule->getName(name);
    switch (dtrule->getDateRuleType()) {
    case DateTimeRule::DOM:
        writeZonePropsByDOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW:
        writeZonePropsByDOW(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleWeekInMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_GEQ_DOM:
        writeZonePropsByDOW_GEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_LEQ_DOM:
        writeZonePropsByDOW_LEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    }
    if (modifiedRule) {
        delete dtrule;
    }
}